

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void __thiscall
embree::sse2::
BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse2::ArrayIntersectorK_1<4,_embree::sse2::InstanceArrayIntersectorK<4>_>,_false>
::occludedCoherent(BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse2::ArrayIntersectorK_1<4,_embree::sse2::InstanceArrayIntersectorK<4>_>,_false>
                   *this,vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  StackItemMaskT<embree::NodeRefPtr<4>_> *pSVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  StackItemMaskT<embree::NodeRefPtr<4>_> *pSVar14;
  undefined4 in_EAX;
  uint uVar15;
  int iVar16;
  vbool<4> *pvVar17;
  ulong uVar18;
  ulong uVar19;
  StackItemMaskT<embree::NodeRefPtr<4>_> *pSVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  NodeRef nodeRef;
  Primitive *prim;
  undefined4 uVar25;
  vbool<4> *pvVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  bool bVar30;
  uint uVar31;
  uint uVar32;
  undefined1 auVar33 [12];
  float fVar42;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar43 [12];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [12];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [12];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar93;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar101;
  float fVar102;
  float fVar111;
  float fVar113;
  float fVar115;
  undefined1 auVar103 [16];
  float fVar112;
  float fVar114;
  float fVar116;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  Collider CVar122;
  undefined1 auVar123 [16];
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  vbool<4> vVar128;
  Precalculations pre;
  ulong local_11a0;
  undefined1 local_1198 [16];
  undefined1 local_1188 [16];
  undefined4 local_1178;
  undefined4 uStack_1170;
  vbool<4> valid0;
  undefined1 local_10f8 [16];
  int local_10e8;
  int iStack_10e4;
  int iStack_10e0;
  int iStack_10dc;
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  undefined1 local_1088 [16];
  Collider local_1078;
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  undefined1 local_1038 [8];
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  undefined1 local_fa8 [16];
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  uint local_f88;
  uint uStack_f84;
  uint uStack_f80;
  uint uStack_f7c;
  StackItemMaskT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 auVar38 [16];
  undefined1 auVar106 [16];
  
  auVar35._8_4_ = 0xffffffff;
  auVar35._0_8_ = 0xffffffffffffffff;
  auVar35._12_4_ = 0xffffffff;
  auVar34._0_4_ = -(uint)(*(int *)this == -1);
  auVar34._4_4_ = -(uint)(*(int *)(this + 4) == -1);
  auVar34._8_4_ = -(uint)(*(int *)(this + 8) == -1);
  auVar34._12_4_ = -(uint)(*(int *)(this + 0xc) == -1);
  uVar15 = movmskps(in_EAX,auVar34);
  if (uVar15 == 0) {
    return;
  }
  local_10e8 = *(int *)this;
  iStack_10e4 = *(int *)(this + 4);
  iStack_10e0 = *(int *)(this + 8);
  iStack_10dc = *(int *)(this + 0xc);
  lVar5 = (valid_i->field_0).v[0];
  auVar120 = auVar34 ^ auVar35;
  auVar121._0_8_ = This->ptr;
  auVar121._8_8_ = This->leafIntersector;
  CVar122 = This->collider;
  auVar123._0_8_ = (This->intersector1).intersect;
  auVar123._8_8_ = (This->intersector1).occluded;
  auVar67._0_8_ = (This->intersector1).pointQuery;
  auVar67._8_8_ = (This->intersector1).name;
  fVar42 = *(float *)&(This->intersector4).intersect;
  fVar93 = *(float *)((long)&(This->intersector4).intersect + 4);
  fVar56 = *(float *)&(This->intersector4).occluded;
  fVar3 = *(float *)((long)&(This->intersector4).occluded + 4);
  fVar101 = (float)DAT_01f80d30;
  fVar111 = DAT_01f80d30._4_4_;
  fVar113 = DAT_01f80d30._8_4_;
  fVar115 = DAT_01f80d30._12_4_;
  auVar69._0_4_ = (uint)fVar42 & -(uint)(fVar101 <= ABS(fVar42));
  auVar69._4_4_ = (uint)fVar93 & -(uint)(fVar111 <= ABS(fVar93));
  auVar69._8_4_ = (uint)fVar56 & -(uint)(fVar113 <= ABS(fVar56));
  auVar69._12_4_ = (uint)fVar3 & -(uint)(fVar115 <= ABS(fVar3));
  auVar85._0_4_ = ~-(uint)(fVar101 <= ABS(fVar42)) & (uint)fVar101;
  auVar85._4_4_ = ~-(uint)(fVar111 <= ABS(fVar93)) & (uint)fVar111;
  auVar85._8_4_ = ~-(uint)(fVar113 <= ABS(fVar56)) & (uint)fVar113;
  auVar85._12_4_ = ~-(uint)(fVar115 <= ABS(fVar3)) & (uint)fVar115;
  auVar85 = auVar85 | auVar69;
  fVar4 = *(float *)&(This->intersector4).name;
  fVar7 = *(float *)((long)&(This->intersector4).name + 4);
  fVar8 = *(float *)&(This->intersector4_filter).intersect;
  fVar9 = *(float *)((long)&(This->intersector4_filter).intersect + 4);
  auVar80._0_4_ = (uint)fVar4 & -(uint)(fVar101 <= ABS(fVar4));
  auVar80._4_4_ = (uint)fVar7 & -(uint)(fVar111 <= ABS(fVar7));
  auVar80._8_4_ = (uint)fVar8 & -(uint)(fVar113 <= ABS(fVar8));
  auVar80._12_4_ = (uint)fVar9 & -(uint)(fVar115 <= ABS(fVar9));
  auVar94._0_4_ = ~-(uint)(fVar101 <= ABS(fVar4)) & (uint)fVar101;
  auVar94._4_4_ = ~-(uint)(fVar111 <= ABS(fVar7)) & (uint)fVar111;
  auVar94._8_4_ = ~-(uint)(fVar113 <= ABS(fVar8)) & (uint)fVar113;
  auVar94._12_4_ = ~-(uint)(fVar115 <= ABS(fVar9)) & (uint)fVar115;
  auVar94 = auVar94 | auVar80;
  fVar10 = *(float *)&(This->intersector4_filter).occluded;
  fVar11 = *(float *)((long)&(This->intersector4_filter).occluded + 4);
  fVar12 = *(float *)&(This->intersector4_filter).name;
  fVar13 = *(float *)((long)&(This->intersector4_filter).name + 4);
  auVar77._0_4_ = ~-(uint)(fVar101 <= ABS(fVar10)) & (uint)fVar101;
  auVar77._4_4_ = ~-(uint)(fVar111 <= ABS(fVar11)) & (uint)fVar111;
  auVar77._8_4_ = ~-(uint)(fVar113 <= ABS(fVar12)) & (uint)fVar113;
  auVar77._12_4_ = ~-(uint)(fVar115 <= ABS(fVar13)) & (uint)fVar115;
  auVar103._4_4_ = (uint)fVar11 & -(uint)(fVar111 <= ABS(fVar11));
  auVar103._0_4_ = (uint)fVar10 & -(uint)(fVar101 <= ABS(fVar10));
  auVar103._8_4_ = (uint)fVar12 & -(uint)(fVar113 <= ABS(fVar12));
  auVar103._12_4_ = (uint)fVar13 & -(uint)(fVar115 <= ABS(fVar13));
  auVar77 = auVar77 | auVar103;
  auVar103 = rcpps(_DAT_01f80d30,auVar85);
  fVar124 = auVar103._0_4_;
  auVar86._0_4_ = auVar85._0_4_ * fVar124;
  fVar125 = auVar103._4_4_;
  auVar86._4_4_ = auVar85._4_4_ * fVar125;
  fVar126 = auVar103._8_4_;
  auVar86._8_4_ = auVar85._8_4_ * fVar126;
  fVar127 = auVar103._12_4_;
  auVar86._12_4_ = auVar85._12_4_ * fVar127;
  fVar124 = (1.0 - auVar86._0_4_) * fVar124 + fVar124;
  fVar125 = (1.0 - auVar86._4_4_) * fVar125 + fVar125;
  fVar126 = (1.0 - auVar86._8_4_) * fVar126 + fVar126;
  fVar127 = (1.0 - auVar86._12_4_) * fVar127 + fVar127;
  auVar103 = rcpps(auVar86,auVar94);
  fVar102 = auVar103._0_4_;
  fVar112 = auVar103._4_4_;
  fVar114 = auVar103._8_4_;
  fVar116 = auVar103._12_4_;
  fVar102 = (1.0 - auVar94._0_4_ * fVar102) * fVar102 + fVar102;
  fVar112 = (1.0 - auVar94._4_4_ * fVar112) * fVar112 + fVar112;
  fVar114 = (1.0 - auVar94._8_4_ * fVar114) * fVar114 + fVar114;
  fVar116 = (1.0 - auVar94._12_4_ * fVar116) * fVar116 + fVar116;
  auVar103 = rcpps(auVar103,auVar77);
  fVar101 = auVar103._0_4_;
  fVar111 = auVar103._4_4_;
  fVar113 = auVar103._8_4_;
  fVar115 = auVar103._12_4_;
  fVar101 = (1.0 - auVar77._0_4_ * fVar101) * fVar101 + fVar101;
  fVar111 = (1.0 - auVar77._4_4_ * fVar111) * fVar111 + fVar111;
  fVar113 = (1.0 - auVar77._8_4_ * fVar113) * fVar113 + fVar113;
  fVar115 = (1.0 - auVar77._12_4_ * fVar115) * fVar115 + fVar115;
  auVar118._0_12_ = ZEXT812(0);
  auVar118._12_4_ = 0;
  auVar57._0_8_ = CONCAT44(-(uint)(fVar93 < 0.0),-(uint)(fVar42 < 0.0)) & 0x100000001;
  auVar57._8_4_ = -(uint)(fVar56 < 0.0) & 1;
  auVar57._12_4_ = -(uint)(fVar3 < 0.0) & 1;
  local_10c8 = maxps(auVar67,auVar118);
  auVar71._0_8_ = CONCAT44(-(uint)(fVar7 < 0.0),-(uint)(fVar4 < 0.0)) & 0x200000002;
  auVar71._8_4_ = -(uint)(fVar8 < 0.0) & 2;
  auVar71._12_4_ = -(uint)(fVar9 < 0.0) & 2;
  auVar98._0_8_ = CONCAT44(-(uint)(fVar11 < 0.0),-(uint)(fVar10 < 0.0)) & 0x400000004;
  auVar98._8_4_ = -(uint)(fVar12 < 0.0) & 4;
  auVar98._12_4_ = -(uint)(fVar13 < 0.0) & 4;
  local_10d8 = maxps(*(undefined1 (*) [16])&(This->intersector4_nofilter).name,auVar118);
  local_10f8 = auVar34 ^ auVar35 | auVar57 | auVar98 | auVar71;
  local_1068 = auVar121;
  local_1078 = CVar122;
  local_1088 = auVar123;
  local_1098 = fVar101;
  fStack_1094 = fVar111;
  fStack_1090 = fVar113;
  fStack_108c = fVar115;
  local_10a8 = fVar124;
  fStack_10a4 = fVar125;
  fStack_10a0 = fVar126;
  fStack_109c = fVar127;
  local_10b8 = fVar102;
  fStack_10b4 = fVar112;
  fStack_10b0 = fVar114;
  fStack_10ac = fVar116;
  pvVar17 = (vbool<4> *)(ulong)(uVar15 & 0xff);
LAB_00208b8f:
  lVar6 = 0;
  if (pvVar17 != (vbool<4> *)0x0) {
    for (; ((ulong)pvVar17 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
    }
  }
  iVar16 = *(int *)(local_10f8 + lVar6 * 4);
  local_1198._0_4_ = -(uint)(iVar16 == local_10f8._0_4_);
  local_1198._4_4_ = -(uint)(iVar16 == local_10f8._4_4_);
  local_1198._8_4_ = -(uint)(iVar16 == local_10f8._8_4_);
  local_1198._12_4_ = -(uint)(iVar16 == local_10f8._12_4_);
  uVar25 = movmskps((int)valid_i,local_1198);
  stack[0].mask = CONCAT44((int)((ulong)valid_i >> 0x20),uVar25);
  stack[0].ptr.ptr = *(size_t *)(lVar5 + 0x70);
  auVar57 = ~local_1198 & _DAT_01f7a9f0;
  auVar34 = local_10c8 & local_1198 | auVar57;
  auVar35 = ~local_1198 & _DAT_01f7aa00;
  local_1188 = local_10d8 & local_1198 | auVar35;
  auVar67 = auVar121 & local_1198 | auVar57;
  auVar78._4_4_ = auVar67._0_4_;
  auVar78._0_4_ = auVar67._4_4_;
  auVar78._8_4_ = auVar67._12_4_;
  auVar78._12_4_ = auVar67._8_4_;
  auVar67 = minps(auVar78,auVar67);
  auVar68._0_8_ = auVar67._8_8_;
  auVar68._8_4_ = auVar67._0_4_;
  auVar68._12_4_ = auVar67._4_4_;
  auVar69 = minps(auVar68,auVar67);
  auVar67 = (undefined1  [16])CVar122 & local_1198 | auVar57;
  auVar95._4_4_ = auVar67._0_4_;
  auVar95._0_4_ = auVar67._4_4_;
  auVar95._8_4_ = auVar67._12_4_;
  auVar95._12_4_ = auVar67._8_4_;
  auVar67 = minps(auVar95,auVar67);
  auVar117._0_8_ = auVar67._8_8_;
  auVar117._8_4_ = auVar67._0_4_;
  auVar117._12_4_ = auVar67._4_4_;
  auVar118 = minps(auVar117,auVar67);
  auVar67 = auVar123 & local_1198 | auVar57;
  auVar96._4_4_ = auVar67._0_4_;
  auVar96._0_4_ = auVar67._4_4_;
  auVar96._8_4_ = auVar67._12_4_;
  auVar96._12_4_ = auVar67._8_4_;
  auVar67 = minps(auVar96,auVar67);
  auVar87._0_8_ = auVar67._8_8_;
  auVar87._8_4_ = auVar67._0_4_;
  auVar87._12_4_ = auVar67._4_4_;
  auVar77 = minps(auVar87,auVar67);
  auVar67 = auVar121 & local_1198 | auVar35;
  auVar88._4_4_ = auVar67._0_4_;
  auVar88._0_4_ = auVar67._4_4_;
  auVar88._8_4_ = auVar67._12_4_;
  auVar88._12_4_ = auVar67._8_4_;
  auVar67 = maxps(auVar88,auVar67);
  auVar44._0_8_ = auVar67._8_8_;
  auVar44._8_4_ = auVar67._0_4_;
  auVar44._12_4_ = auVar67._4_4_;
  auVar67 = maxps(auVar44,auVar67);
  auVar103 = (undefined1  [16])CVar122 & local_1198 | auVar35;
  auVar89._4_4_ = auVar103._0_4_;
  auVar89._0_4_ = auVar103._4_4_;
  auVar89._8_4_ = auVar103._12_4_;
  auVar89._12_4_ = auVar103._8_4_;
  auVar103 = maxps(auVar89,auVar103);
  auVar79._0_8_ = auVar103._8_8_;
  auVar79._8_4_ = auVar103._0_4_;
  auVar79._12_4_ = auVar103._4_4_;
  auVar80 = maxps(auVar79,auVar103);
  auVar103 = auVar123 & local_1198 | auVar35;
  auVar45._4_4_ = auVar103._0_4_;
  auVar45._0_4_ = auVar103._4_4_;
  auVar45._8_4_ = auVar103._12_4_;
  auVar45._12_4_ = auVar103._8_4_;
  auVar103 = maxps(auVar45,auVar103);
  auVar70._0_8_ = auVar103._8_8_;
  auVar70._8_4_ = auVar103._0_4_;
  auVar70._12_4_ = auVar103._4_4_;
  auVar71 = maxps(auVar70,auVar103);
  auVar72._0_8_ = CONCAT44((uint)fVar125 & local_1198._4_4_,(uint)fVar124 & local_1198._0_4_);
  auVar72._8_4_ = (uint)fVar126 & local_1198._8_4_;
  auVar72._12_4_ = (uint)fVar127 & local_1198._12_4_;
  auVar81._8_4_ = auVar72._8_4_;
  auVar81._0_8_ = auVar72._0_8_;
  auVar81._12_4_ = auVar72._12_4_;
  auVar81 = auVar81 | auVar57;
  auVar46._4_4_ = auVar81._0_4_;
  auVar46._0_4_ = auVar81._4_4_;
  auVar46._8_4_ = auVar81._12_4_;
  auVar46._12_4_ = auVar81._8_4_;
  auVar103 = minps(auVar46,auVar81);
  auVar82._0_8_ = CONCAT44((uint)fVar112 & local_1198._4_4_,(uint)fVar102 & local_1198._0_4_);
  auVar82._8_4_ = (uint)fVar114 & local_1198._8_4_;
  auVar82._12_4_ = (uint)fVar116 & local_1198._12_4_;
  auVar90._8_4_ = auVar82._8_4_;
  auVar90._0_8_ = auVar82._0_8_;
  auVar90._12_4_ = auVar82._12_4_;
  auVar90 = auVar90 | auVar57;
  auVar97._4_4_ = auVar90._0_4_;
  auVar97._0_4_ = auVar90._4_4_;
  auVar97._8_4_ = auVar90._12_4_;
  auVar97._12_4_ = auVar90._8_4_;
  auVar98 = minps(auVar97,auVar90);
  auVar91._0_4_ = (uint)fVar101 & local_1198._0_4_;
  auVar91._4_4_ = (uint)fVar111 & local_1198._4_4_;
  auVar91._8_4_ = (uint)fVar113 & local_1198._8_4_;
  auVar91._12_4_ = (uint)fVar115 & local_1198._12_4_;
  auVar57 = auVar57 | auVar91;
  auVar104._4_4_ = auVar57._0_4_;
  auVar104._0_4_ = auVar57._4_4_;
  auVar104._8_4_ = auVar57._12_4_;
  auVar104._12_4_ = auVar57._8_4_;
  auVar57 = minps(auVar104,auVar57);
  auVar58._0_8_ = auVar57._8_8_;
  auVar58._8_4_ = auVar57._0_4_;
  auVar58._12_4_ = auVar57._4_4_;
  auVar57 = minps(auVar58,auVar57);
  auVar106._0_8_ = auVar103._0_8_;
  auVar106._8_4_ = auVar103._4_4_;
  auVar106._12_4_ = auVar98._4_4_;
  auVar105._8_8_ = auVar106._8_8_;
  auVar105._0_4_ = auVar103._0_4_;
  auVar105._4_4_ = auVar98._0_4_;
  auVar47._4_4_ = auVar98._8_4_;
  auVar47._0_4_ = auVar103._8_4_;
  auVar47._8_4_ = auVar103._12_4_;
  auVar47._12_4_ = auVar98._12_4_;
  auVar103 = minps(auVar47,auVar105);
  fVar56 = auVar57._0_4_;
  fVar42 = auVar103._0_4_;
  fVar93 = auVar103._4_4_;
  auVar72 = auVar72 | auVar35;
  auVar59._4_4_ = auVar72._0_4_;
  auVar59._0_4_ = auVar72._4_4_;
  auVar59._8_4_ = auVar72._12_4_;
  auVar59._12_4_ = auVar72._8_4_;
  auVar103 = maxps(auVar59,auVar72);
  auVar82 = auVar82 | auVar35;
  auVar73._4_4_ = auVar82._0_4_;
  auVar73._0_4_ = auVar82._4_4_;
  auVar73._8_4_ = auVar82._12_4_;
  auVar73._12_4_ = auVar82._8_4_;
  auVar57 = maxps(auVar73,auVar82);
  auVar91 = auVar91 | auVar35;
  auVar36._4_4_ = auVar91._0_4_;
  auVar36._0_4_ = auVar91._4_4_;
  auVar36._8_4_ = auVar91._12_4_;
  auVar36._12_4_ = auVar91._8_4_;
  auVar35 = maxps(auVar36,auVar91);
  auVar83._0_8_ = auVar35._8_8_;
  auVar83._8_4_ = auVar35._0_4_;
  auVar83._12_4_ = auVar35._4_4_;
  auVar98 = maxps(auVar83,auVar35);
  auVar38._0_8_ = auVar103._0_8_;
  auVar38._8_4_ = auVar103._4_4_;
  auVar38._12_4_ = auVar57._4_4_;
  auVar37._8_8_ = auVar38._8_8_;
  auVar37._0_4_ = auVar103._0_4_;
  auVar37._4_4_ = auVar57._0_4_;
  auVar60._4_4_ = auVar57._8_4_;
  auVar60._0_4_ = auVar103._8_4_;
  auVar60._8_4_ = auVar103._12_4_;
  auVar60._12_4_ = auVar57._12_4_;
  auVar35 = maxps(auVar60,auVar37);
  auVar107._4_4_ = auVar34._0_4_;
  auVar107._0_4_ = auVar34._4_4_;
  auVar107._8_4_ = auVar34._12_4_;
  auVar107._12_4_ = auVar34._8_4_;
  auVar57 = minps(auVar107,auVar34);
  auVar74._4_4_ = local_1188._0_4_;
  auVar74._0_4_ = local_1188._4_4_;
  auVar74._8_4_ = local_1188._12_4_;
  auVar74._12_4_ = local_1188._8_4_;
  auVar103 = maxps(auVar74,local_1188);
  uVar15 = -(uint)(fVar42 < 0.0);
  uVar31 = -(uint)(fVar93 < 0.0);
  uVar32 = -(uint)(fVar56 < 0.0);
  auVar76._0_4_ = ~uVar15 & (uint)fVar42;
  auVar76._4_4_ = ~uVar31 & (uint)fVar93;
  auVar76._8_4_ = ~uVar32 & (uint)fVar56;
  auVar66._0_4_ = auVar35._0_4_ & uVar15;
  auVar66._4_4_ = auVar35._4_4_ & uVar31;
  auVar66._8_4_ = auVar98._0_4_ & uVar32;
  auVar66 = auVar66 | auVar76;
  local_fc8 = auVar66._0_4_;
  local_fb8 = auVar66._4_4_;
  local_ff8 = auVar66._8_4_;
  fStack_fb4 = local_fb8;
  fStack_fb0 = local_fb8;
  fStack_fac = local_fb8;
  uVar23 = (ulong)(local_fb8 < 0.0) << 4 | 0x20;
  uVar29 = (ulong)(local_ff8 < 0.0) << 4 | 0x40;
  uVar24 = uVar23 ^ 0x10;
  pvVar26 = (vbool<4> *)(~stack[0].mask & (ulong)pvVar17);
  auVar43._0_4_ = (uint)fVar42 & uVar15;
  auVar43._4_4_ = (uint)fVar93 & uVar31;
  auVar43._8_4_ = (uint)fVar56 & uVar32;
  auVar33._0_4_ = ~uVar15 & auVar35._0_4_;
  auVar33._4_4_ = ~uVar31 & auVar35._4_4_;
  auVar33._8_4_ = ~uVar32 & auVar98._0_4_;
  auVar33 = auVar33 | auVar43;
  local_fd8 = (float)(auVar69._0_4_ & uVar15 | ~uVar15 & auVar67._0_4_) * local_fc8;
  local_fe8 = (float)(auVar118._0_4_ & uVar31 | ~uVar31 & auVar80._0_4_) * local_fb8;
  local_f98 = (float)(auVar77._0_4_ & uVar32 | ~uVar32 & auVar71._0_4_) * local_ff8;
  local_1008 = auVar33._0_4_;
  local_1018 = (float)(auVar67._0_4_ & uVar15 | ~uVar15 & auVar69._0_4_) * local_1008;
  fVar42 = auVar33._4_4_;
  local_1028 = (float)(auVar80._0_4_ & uVar31 | ~uVar31 & auVar118._0_4_) * fVar42;
  local_1048 = auVar33._8_4_;
  fVar93 = (float)(auVar71._0_4_ & uVar32 | ~uVar32 & auVar77._0_4_) * local_1048;
  uVar28 = (ulong)(local_fc8 < 0.0) * 0x10;
  fStack_fc4 = local_fc8;
  fStack_fc0 = local_fc8;
  fStack_fbc = local_fc8;
  fStack_fd4 = local_fd8;
  fStack_fd0 = local_fd8;
  fStack_fcc = local_fd8;
  fStack_fe4 = local_fe8;
  fStack_fe0 = local_fe8;
  fStack_fdc = local_fe8;
  fStack_ff4 = local_ff8;
  fStack_ff0 = local_ff8;
  fStack_fec = local_ff8;
  fStack_f94 = local_f98;
  fStack_f90 = local_f98;
  fStack_f8c = local_f98;
  auVar119._8_4_ = 0xffffffff;
  auVar119._0_8_ = 0xffffffffffffffff;
  auVar119._12_4_ = 0xffffffff;
  fStack_1004 = local_1008;
  fStack_1000 = local_1008;
  fStack_ffc = local_1008;
  fStack_1014 = local_1018;
  fStack_1010 = local_1018;
  fStack_100c = local_1018;
  uVar25 = auVar57._0_4_;
  auVar108._8_4_ = auVar57._8_4_;
  auVar48._4_4_ = uVar25;
  auVar48._0_4_ = uVar25;
  auVar48._8_4_ = uVar25;
  auVar48._12_4_ = uVar25;
  auVar108._4_4_ = auVar108._8_4_;
  auVar108._0_4_ = auVar108._8_4_;
  auVar108._12_4_ = auVar108._8_4_;
  local_fa8 = minps(auVar108,auVar48);
  local_1178 = auVar103._0_4_;
  uStack_1170 = auVar103._8_4_;
  auVar49._4_4_ = local_1178;
  auVar49._0_4_ = local_1178;
  auVar49._8_4_ = local_1178;
  auVar49._12_4_ = local_1178;
  auVar61._4_4_ = uStack_1170;
  auVar61._0_4_ = uStack_1170;
  auVar61._8_4_ = uStack_1170;
  auVar61._12_4_ = uStack_1170;
  auVar35 = maxps(auVar61,auVar49);
  fStack_1024 = local_1028;
  fStack_1020 = local_1028;
  fStack_101c = local_1028;
  local_1038._4_4_ = fVar42;
  local_1038._0_4_ = fVar42;
  fStack_1030 = fVar42;
  fStack_102c = fVar42;
  fStack_1044 = local_1048;
  fStack_1040 = local_1048;
  fStack_103c = local_1048;
  uVar15 = movmskps((int)pvVar17,auVar120);
  uVar18 = (ulong)uVar15;
  pSVar20 = stack + 1;
  valid_i = (vint<4> *)pvVar26;
LAB_00208f37:
  uVar18 = ~uVar18;
  while (pSVar1 = pSVar20 + -1, pSVar14 = pSVar20 + -1, pSVar20 = pSVar1,
        (pSVar14->mask & uVar18) != 0) {
    uVar22 = (pSVar1->ptr).ptr;
    uVar19 = uVar22;
    if ((uVar22 & 8) != 0) {
LAB_0020912a:
      valid0.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar120 ^ auVar119);
      uVar19 = (ulong)((uint)uVar22 & 0xf) - 8;
      uVar18 = uVar19;
      local_1058 = auVar120;
      if (uVar19 == 0) goto LAB_0020921a;
      prim = (Primitive *)(uVar22 & 0xfffffffffffffff0);
      local_11a0 = 1;
      goto LAB_0020916a;
    }
    while( true ) {
      pfVar2 = (float *)(uVar19 + 0x20 + uVar28);
      auVar39._0_4_ = *pfVar2 * local_fc8 - local_fd8;
      auVar39._4_4_ = pfVar2[1] * fStack_fc4 - fStack_fd4;
      auVar39._8_4_ = pfVar2[2] * fStack_fc0 - fStack_fd0;
      auVar39._12_4_ = pfVar2[3] * fStack_fbc - fStack_fcc;
      pfVar2 = (float *)(uVar19 + 0x20 + uVar23);
      auVar50._0_4_ = *pfVar2 * local_fb8 - local_fe8;
      auVar50._4_4_ = pfVar2[1] * fStack_fb4 - fStack_fe4;
      auVar50._8_4_ = pfVar2[2] * fStack_fb0 - fStack_fe0;
      auVar50._12_4_ = pfVar2[3] * fStack_fac - fStack_fdc;
      auVar67 = maxps(auVar39,auVar50);
      pfVar2 = (float *)(uVar19 + 0x20 + uVar29);
      auVar51._0_4_ = *pfVar2 * local_ff8 - local_f98;
      auVar51._4_4_ = pfVar2[1] * fStack_ff4 - fStack_f94;
      auVar51._8_4_ = pfVar2[2] * fStack_ff0 - fStack_f90;
      auVar51._12_4_ = pfVar2[3] * fStack_fec - fStack_f8c;
      auVar103 = maxps(auVar51,local_fa8);
      auVar67 = maxps(auVar67,auVar103);
      pfVar2 = (float *)(uVar19 + 0x20 + (uVar28 ^ 0x10));
      auVar52._0_4_ = *pfVar2 * local_1008 - local_1018;
      auVar52._4_4_ = pfVar2[1] * fStack_1004 - fStack_1014;
      auVar52._8_4_ = pfVar2[2] * fStack_1000 - fStack_1010;
      auVar52._12_4_ = pfVar2[3] * fStack_ffc - fStack_100c;
      pfVar2 = (float *)(uVar19 + 0x20 + uVar24);
      auVar62._0_4_ = *pfVar2 * (float)local_1038._0_4_ - local_1028;
      auVar62._4_4_ = pfVar2[1] * (float)local_1038._4_4_ - fStack_1024;
      auVar62._8_4_ = pfVar2[2] * fStack_1030 - fStack_1020;
      auVar62._12_4_ = pfVar2[3] * fStack_102c - fStack_101c;
      auVar103 = minps(auVar52,auVar62);
      pfVar2 = (float *)(uVar19 + 0x20 + (uVar29 ^ 0x10));
      auVar63._0_4_ = *pfVar2 * local_1048 - fVar93;
      auVar63._4_4_ = pfVar2[1] * fStack_1044 - fVar93;
      auVar63._8_4_ = pfVar2[2] * fStack_1040 - fVar93;
      auVar63._12_4_ = pfVar2[3] * fStack_103c - fVar93;
      auVar57 = minps(auVar63,auVar35);
      auVar103 = minps(auVar103,auVar57);
      auVar40._4_4_ = -(uint)(auVar67._4_4_ <= auVar103._4_4_);
      auVar40._0_4_ = -(uint)(auVar67._0_4_ <= auVar103._0_4_);
      auVar40._8_4_ = -(uint)(auVar67._8_4_ <= auVar103._8_4_);
      auVar40._12_4_ = -(uint)(auVar67._12_4_ <= auVar103._12_4_);
      uVar15 = movmskps((int)uVar24,auVar40);
      if (uVar15 == 0) break;
      uVar27 = (ulong)(uVar15 & 0xff);
      valid_i = (vint<4> *)0x0;
      uVar21 = 8;
      do {
        lVar6 = 0;
        if (uVar27 != 0) {
          for (; (uVar27 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
          }
        }
        fVar42 = *(float *)(uVar19 + 0x20 + lVar6 * 4);
        fVar56 = *(float *)(uVar19 + 0x30 + lVar6 * 4);
        fVar3 = *(float *)(uVar19 + 0x40 + lVar6 * 4);
        fVar4 = *(float *)(uVar19 + 0x50 + lVar6 * 4);
        auVar41._0_8_ =
             CONCAT44((fVar42 - auVar121._4_4_) * fVar125,(fVar42 - auVar121._0_4_) * fVar124);
        auVar41._8_4_ = (fVar42 - auVar121._8_4_) * fVar126;
        auVar41._12_4_ = (fVar42 - auVar121._12_4_) * fVar127;
        auVar53._0_8_ =
             CONCAT44((fVar3 - CVar122.collide._4_4_) * fVar112,
                      (fVar3 - CVar122.collide._0_4_) * fVar102);
        auVar53._8_4_ = (fVar3 - CVar122.name._0_4_) * fVar114;
        auVar53._12_4_ = (fVar3 - CVar122.name._4_4_) * fVar116;
        fVar42 = *(float *)(uVar19 + 0x60 + lVar6 * 4);
        auVar84._0_8_ =
             CONCAT44((fVar42 - auVar123._4_4_) * fVar111,(fVar42 - auVar123._0_4_) * fVar101);
        auVar84._8_4_ = (fVar42 - auVar123._8_4_) * fVar113;
        auVar84._12_4_ = (fVar42 - auVar123._12_4_) * fVar115;
        auVar64._0_4_ = (fVar56 - auVar121._0_4_) * fVar124;
        auVar64._4_4_ = (fVar56 - auVar121._4_4_) * fVar125;
        auVar64._8_4_ = (fVar56 - auVar121._8_4_) * fVar126;
        auVar64._12_4_ = (fVar56 - auVar121._12_4_) * fVar127;
        auVar75._0_4_ = (fVar4 - CVar122.collide._0_4_) * fVar102;
        auVar75._4_4_ = (fVar4 - CVar122.collide._4_4_) * fVar112;
        auVar75._8_4_ = (fVar4 - CVar122.name._0_4_) * fVar114;
        auVar75._12_4_ = (fVar4 - CVar122.name._4_4_) * fVar116;
        fVar42 = *(float *)(uVar19 + 0x70 + lVar6 * 4);
        auVar92._0_4_ = (fVar42 - auVar123._0_4_) * fVar101;
        auVar92._4_4_ = (fVar42 - auVar123._4_4_) * fVar111;
        auVar92._8_4_ = (fVar42 - auVar123._8_4_) * fVar113;
        auVar92._12_4_ = (fVar42 - auVar123._12_4_) * fVar115;
        auVar99._8_4_ = auVar41._8_4_;
        auVar99._0_8_ = auVar41._0_8_;
        auVar99._12_4_ = auVar41._12_4_;
        auVar67 = minps(auVar99,auVar64);
        auVar109._8_4_ = auVar53._8_4_;
        auVar109._0_8_ = auVar53._0_8_;
        auVar109._12_4_ = auVar53._12_4_;
        auVar103 = minps(auVar109,auVar75);
        auVar67 = maxps(auVar67,auVar103);
        auVar110._8_4_ = auVar84._8_4_;
        auVar110._0_8_ = auVar84._0_8_;
        auVar110._12_4_ = auVar84._12_4_;
        auVar103 = minps(auVar110,auVar92);
        auVar57 = maxps(auVar67,auVar103);
        auVar67 = maxps(auVar41,auVar64);
        auVar103 = maxps(auVar53,auVar75);
        auVar67 = minps(auVar67,auVar103);
        auVar103 = maxps(auVar84,auVar92);
        auVar67 = minps(auVar67,auVar103);
        auVar103 = maxps(auVar57,auVar34);
        auVar67 = minps(auVar67,local_1188);
        auVar100._4_4_ = -(uint)(auVar103._4_4_ <= auVar67._4_4_);
        auVar100._0_4_ = -(uint)(auVar103._0_4_ <= auVar67._0_4_);
        auVar100._8_4_ = -(uint)(auVar103._8_4_ <= auVar67._8_4_);
        auVar100._12_4_ = -(uint)(auVar103._12_4_ <= auVar67._12_4_);
        uVar15 = movmskps((int)context,auVar100);
        context = (RayQueryContext *)(ulong)uVar15;
        uVar22 = uVar21;
        if (uVar15 != 0) {
          uVar22 = *(ulong *)(uVar19 + lVar6 * 8);
          if (uVar21 != 8) {
            (pSVar20->ptr).ptr = uVar21;
            pSVar20->mask = (size_t)valid_i;
            pSVar20 = pSVar20 + 1;
          }
          valid_i = (vint<4> *)((ulong)context & 0xff);
        }
        uVar27 = uVar27 & uVar27 - 1;
        uVar21 = uVar22;
      } while (uVar27 != 0);
      if (uVar22 == 8) break;
      uVar19 = uVar22;
      if ((uVar22 & 8) != 0) {
        if ((vbool<4> *)valid_i == (vbool<4> *)0x0) goto LAB_0020924e;
        goto LAB_0020912a;
      }
    }
    if (pSVar20 == stack) goto LAB_00209269;
  }
  goto LAB_0020924e;
  while( true ) {
    prim = (Primitive *)&prim->instID_;
    uVar18 = local_11a0 + 1;
    bVar30 = uVar19 <= local_11a0;
    local_11a0 = uVar18;
    if (bVar30) break;
LAB_0020916a:
    valid_i = (vint<4> *)&valid0;
    context = (RayQueryContext *)ray;
    vVar128 = InstanceArrayIntersectorK<4>::occluded
                        ((InstanceArrayIntersectorK<4> *)&local_f88,(vbool<4> *)valid_i,&pre,
                         (RayK<4> *)This,(RayQueryContext *)ray,prim);
    valid0.field_0.i[0] = ~local_f88 & valid0.field_0.i[0];
    valid0.field_0.i[1] = ~uStack_f84 & valid0.field_0.i[1];
    valid0.field_0.i[2] = ~uStack_f80 & valid0.field_0.i[2];
    valid0.field_0.i[3] = ~uStack_f7c & valid0.field_0.i[3];
    iVar16 = movmskps(vVar128.field_0._0_4_,(undefined1  [16])valid0.field_0);
    uVar18 = CONCAT44(vVar128.field_0._4_4_,iVar16);
    if (iVar16 == 0) break;
  }
  auVar119._8_4_ = 0xffffffff;
  auVar119._0_8_ = 0xffffffffffffffff;
  auVar119._12_4_ = 0xffffffff;
  uVar22 = CONCAT44(valid0.field_0.i[1],valid0.field_0.i[0]);
  auVar120._0_8_ = uVar22 ^ 0xffffffffffffffff;
  auVar120._8_4_ = valid0.field_0.i[2] ^ 0xffffffff;
  auVar120._12_4_ = valid0.field_0.i[3] ^ 0xffffffff;
  fVar101 = local_1098;
  fVar111 = fStack_1094;
  fVar113 = fStack_1090;
  fVar115 = fStack_108c;
  auVar121 = local_1068;
  CVar122 = local_1078;
  auVar123 = local_1088;
  fVar124 = local_10a8;
  fVar125 = fStack_10a4;
  fVar126 = fStack_10a0;
  fVar127 = fStack_109c;
  fVar102 = local_10b8;
  fVar112 = fStack_10b4;
  fVar114 = fStack_10b0;
  fVar116 = fStack_10ac;
LAB_0020921a:
  auVar120 = local_1058 | auVar120;
  uVar31 = auVar120._12_4_;
  local_1198._0_4_ = ~auVar120._0_4_ & local_1198._0_4_;
  local_1198._4_4_ = ~auVar120._4_4_ & local_1198._4_4_;
  uVar15 = auVar120._8_4_;
  local_1198._8_4_ = ~uVar15 & local_1198._8_4_;
  local_1198._12_4_ = ~uVar31 & local_1198._12_4_;
  iVar16 = movmskps((int)uVar18,local_1198);
  uVar18 = CONCAT44((int)(uVar18 >> 0x20),iVar16);
  if (iVar16 == 0) goto LAB_00209269;
  auVar65._0_8_ = auVar120._0_8_ & 0xff800000ff800000;
  auVar65._8_4_ = uVar15 & 0xff800000;
  auVar65._12_4_ = uVar31 & 0xff800000;
  auVar54._0_4_ = (auVar120._0_4_ ^ auVar119._0_4_) & local_1188._0_4_;
  auVar54._4_4_ = (auVar120._4_4_ ^ auVar119._4_4_) & local_1188._4_4_;
  auVar54._8_4_ = (uVar15 ^ auVar119._8_4_) & local_1188._8_4_;
  auVar54._12_4_ = (uVar31 ^ auVar119._12_4_) & local_1188._12_4_;
  local_1188 = auVar54 | auVar65;
LAB_0020924e:
  uVar25 = movmskps((int)uVar18,auVar120);
  uVar18 = CONCAT44((int)(uVar18 >> 0x20),uVar25);
  if (pSVar20 == stack) goto LAB_00209269;
  goto LAB_00208f37;
LAB_00209269:
  pvVar17 = pvVar26;
  if (pvVar26 == (vbool<4> *)0x0) {
    auVar55._0_4_ = -(uint)(local_10e8 == -1);
    auVar55._4_4_ = -(uint)(iStack_10e4 == -1);
    auVar55._8_4_ = -(uint)(iStack_10e0 == -1);
    auVar55._12_4_ = -(uint)(iStack_10dc == -1);
    *(undefined1 (*) [16])&(This->intersector4_nofilter).name =
         ~(auVar55 & auVar120) & *(undefined1 (*) [16])&(This->intersector4_nofilter).name |
         _DAT_01f7aa00 & auVar55 & auVar120;
    return;
  }
  goto LAB_00208b8f;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occludedCoherent(vint<K>* __restrict__ valid_i,
                                                                                                      Accel::Intersectors* __restrict__ This,
                                                                                                      RayK<K>& __restrict__ ray,
                                                                                                      RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid,ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      vbool<K> terminated = !valid;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      do
      {
        const size_t valid_index = bsf(valid_bits);
        vbool<K> octant_valid = octant[valid_index] == octant;
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar,  vfloat<K>(neg_inf));

        Frustum<robust> frustum;
        frustum.template init<K>(octant_valid, tray.org, tray.rdir, tray.tnear, tray.tfar, N);

        StackItemMaskT<NodeRef> stack[stackSizeSingle];  // stack of nodes
        StackItemMaskT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
        stack[0].ptr  = bvh->root;
        stack[0].mask = movemask(octant_valid);

        while (1) pop:
        {
          /* pop next node from stack */
          if (unlikely(stackPtr == stack)) break;

          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* cull node of active rays have already been terminated */
          size_t m_active = (size_t)stackPtr->mask & (~(size_t)movemask(terminated));

          if (unlikely(m_active == 0)) continue;

          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            //STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const AABBNode* __restrict__ const node = nodeRef.getAABBNode();

            vfloat<N> fmin;
            size_t m_frustum_node = intersectNodeFrustum<N>(node, frustum, fmin);

            if (unlikely(!m_frustum_node)) goto pop;
            cur = BVH::emptyNode;
            m_active = 0;

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[popcnt(m_frustum_node)], 1, 1, 1);
#endif
            //size_t num_child_hits = 0;
            do {
              const size_t i = bscf(m_frustum_node);
              vfloat<K> lnearP;
              vbool<K> lhit = false; // motion blur is not supported, so the initial value will be ignored
              STAT3(normal.trav_nodes, 1, 1, 1);
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              if (likely(any(lhit)))
              {                                
                const NodeRef child = node->child(i);
                assert(child != BVH::emptyNode);
                BVHN<N>::prefetch(child);
                if (likely(cur != BVH::emptyNode)) {
                  //num_child_hits++;
                  stackPtr->ptr  = cur;
                  stackPtr->mask = m_active;
                  stackPtr++;
                }
                cur = child;
                m_active = movemask(lhit);
              }
            } while(m_frustum_node);

            if (unlikely(cur == BVH::emptyNode)) goto pop;
          }

          /* intersect leaf */
          assert(cur != BVH::invalidNode);
          assert(cur != BVH::emptyNode);
#if defined(__AVX__)
          STAT3(normal.trav_leaves, 1, popcnt(m_active), K);
#endif
          if (unlikely(!m_active)) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
          octant_valid &= !terminated;
          if (unlikely(none(octant_valid))) break;
          tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

          if (unlikely(lazy_node)) {
            stackPtr->ptr  = lazy_node;
            stackPtr->mask = movemask(octant_valid);
            stackPtr++;
          }
        }
      } while(valid_bits);

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }